

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.hpp
# Opt level: O3

hugeint_t duckdb::MultiplyOperatorOverflowCheck::
          Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (hugeint_t left,hugeint_t right)

{
  bool bVar1;
  OutOfRangeException *this;
  uint64_t uVar2;
  PhysicalType type;
  hugeint_t value;
  hugeint_t value_00;
  hugeint_t result;
  hugeint_t local_c0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar2 = right.upper;
  bVar1 = Hugeint::TryMultiply(left,right,&local_c0);
  if (bVar1) {
    return local_c0;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"Overflow in multiplication of %s (%s * %s)!","");
  TypeIdToString_abi_cxx11_(&local_50,(duckdb *)0xcc,type);
  value.upper = uVar2;
  value.lower = left.upper;
  NumericHelper::ToString<duckdb::hugeint_t>(&local_70,(NumericHelper *)left.lower,value);
  value_00.upper = uVar2;
  value_00.lower = right.upper;
  NumericHelper::ToString<duckdb::hugeint_t>(&local_90,(NumericHelper *)right.lower,value_00);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
             &local_70,&local_90);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryMultiplyOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in multiplication of %s (%s * %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}